

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O3

void cfd::core::logger::log<std::__cxx11::string_const&,unsigned_long&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               unsigned_long *args_1)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string local_68;
  pointer local_48;
  size_type sStack_40;
  unsigned_long local_38;
  
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_48 = (args->_M_dataplus)._M_p;
    sStack_40 = args->_M_string_length;
    local_38 = *args_1;
    pcVar2 = (char *)strlen(fmt);
    format_str.size_ = 0x4d;
    format_str.data_ = pcVar2;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)fmt,format_str,args_00);
    WriteLog(source,lvl,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}